

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::languageSpecItem(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *pAVar1;
  RefAST RVar2;
  bool bVar3;
  int iVar4;
  ASTArray *pAVar5;
  NoViableAltException *pNVar6;
  AST *pAVar7;
  AST *pAVar8;
  AST *pAVar9;
  RefCount<Token> *this_01;
  AST *pAVar10;
  RefAST tmp171_AST;
  RefAST languageSpecItem_AST;
  RefCount<AST> local_160;
  ASTPair currentAST;
  RefAST LL_AST;
  RefCount<AST> local_138;
  RefAST Ilangs_AST;
  RefAST Ilang_AST;
  RefAST Vi2_AST;
  RefAST Vi1_AST;
  RefCount<AST> local_110;
  RefAST I_AST;
  RefCount<Token> local_100;
  RefToken E2;
  RefToken Ilangs;
  RefToken Ilang;
  RefToken Vi2;
  RefToken E1;
  RefToken I;
  RefToken local_c0;
  RefToken local_b8;
  RefAST local_b0;
  RefAST local_a8;
  RefAST local_a0;
  RefAST local_98;
  RefCount<Token> local_90;
  RefToken local_88;
  RefCount<Token> local_80;
  RefCount<Token> local_78;
  RefAST local_70;
  RefAST local_68;
  RefAST local_60;
  RefAST local_58;
  RefToken local_50;
  RefCount<Token> local_48;
  RefCount<Token> local_40;
  RefCount<Token> local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  languageSpecItem_AST = nullAST;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  I.ref = nullToken.ref;
  if (nullToken.ref != (Ref *)0x0) {
    (nullToken.ref)->count = (nullToken.ref)->count + 1;
  }
  if (languageSpecItem_AST.ref != (Ref *)0x0) {
    (languageSpecItem_AST.ref)->count = (languageSpecItem_AST.ref)->count + 1;
  }
  I_AST = languageSpecItem_AST;
  if (I.ref != (Ref *)0x0) {
    (I.ref)->count = (I.ref)->count + 1;
  }
  E1 = I;
  if (languageSpecItem_AST.ref != (Ref *)0x0) {
    (languageSpecItem_AST.ref)->count = (languageSpecItem_AST.ref)->count + 2;
  }
  local_110.ref = languageSpecItem_AST.ref;
  Vi1_AST = languageSpecItem_AST;
  if (I.ref != (Ref *)0x0) {
    (I.ref)->count = (I.ref)->count + 1;
  }
  Vi2 = I;
  if (languageSpecItem_AST.ref != (Ref *)0x0) {
    (languageSpecItem_AST.ref)->count = (languageSpecItem_AST.ref)->count + 1;
  }
  Vi2_AST = languageSpecItem_AST;
  if (I.ref != (Ref *)0x0) {
    (I.ref)->count = (I.ref)->count + 1;
  }
  Ilang = I;
  if (languageSpecItem_AST.ref != (Ref *)0x0) {
    (languageSpecItem_AST.ref)->count = (languageSpecItem_AST.ref)->count + 1;
  }
  Ilang_AST = languageSpecItem_AST;
  if (I.ref != (Ref *)0x0) {
    (I.ref)->count = (I.ref)->count + 1;
  }
  Ilangs = I;
  if (languageSpecItem_AST.ref != (Ref *)0x0) {
    (languageSpecItem_AST.ref)->count = (languageSpecItem_AST.ref)->count + 1;
  }
  Ilangs_AST = languageSpecItem_AST;
  if (I.ref != (Ref *)0x0) {
    (I.ref)->count = (I.ref)->count + 1;
  }
  E2 = I;
  if (languageSpecItem_AST.ref != (Ref *)0x0) {
    (languageSpecItem_AST.ref)->count = (languageSpecItem_AST.ref)->count + 2;
  }
  local_138.ref = languageSpecItem_AST.ref;
  LL_AST = languageSpecItem_AST;
  iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar4 - 0x23U < 2) {
    iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if (iVar4 == 0x24) {
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&tmp171_AST,this,1);
      RefCount<Token>::operator=(&Ilangs,(RefCount<Token> *)&tmp171_AST);
      RefCount<Token>::~RefCount((RefCount<Token> *)&tmp171_AST);
      if (Ilangs.ref != (Ref *)0x0) {
        (Ilangs.ref)->count = (Ilangs.ref)->count + 1;
      }
      local_80.ref = Ilangs.ref;
      ASTFactory::create((ASTFactory *)&tmp171_AST,
                         (RefToken *)&(this->super_LLkParser).super_Parser.astFactory);
      RefCount<AST>::operator=(&Ilangs_AST,&tmp171_AST);
      RefCount<AST>::~RefCount(&tmp171_AST);
      this_01 = &local_80;
    }
    else {
      if (iVar4 != 0x23) {
        pNVar6 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_88,this,1);
        NoViableAltException::NoViableAltException(pNVar6,&local_88);
        __cxa_throw(pNVar6,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&tmp171_AST,this,1);
      RefCount<Token>::operator=(&Ilang,(RefCount<Token> *)&tmp171_AST);
      RefCount<Token>::~RefCount((RefCount<Token> *)&tmp171_AST);
      if (Ilang.ref != (Ref *)0x0) {
        (Ilang.ref)->count = (Ilang.ref)->count + 1;
      }
      local_78.ref = Ilang.ref;
      ASTFactory::create((ASTFactory *)&tmp171_AST,
                         (RefToken *)&(this->super_LLkParser).super_Parser.astFactory);
      RefCount<AST>::operator=(&Ilang_AST,&tmp171_AST);
      RefCount<AST>::~RefCount(&tmp171_AST);
      this_01 = &local_78;
    }
    RefCount<Token>::~RefCount(this_01);
    Parser::match((Parser *)this,iVar4);
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&tmp171_AST,this,1);
    RefCount<Token>::operator=(&E2,(RefCount<Token> *)&tmp171_AST);
    RefCount<Token>::~RefCount((RefCount<Token> *)&tmp171_AST);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    if (E2.ref != (Ref *)0x0) {
      (E2.ref)->count = (E2.ref)->count + 1;
    }
    local_90.ref = E2.ref;
    ASTFactory::create((ASTFactory *)&tmp171_AST,(RefToken *)pAVar1);
    RefCount<AST>::operator=(&local_138,&tmp171_AST);
    RefCount<AST>::~RefCount(&tmp171_AST);
    RefCount<Token>::~RefCount(&local_90);
    Parser::match((Parser *)this,4);
    languageCodeList(this);
    RefCount<AST>::operator=(&LL_AST,this_00);
    RefCount<AST>::operator=(&languageSpecItem_AST,&currentAST.root);
    pAVar5 = (ASTArray *)operator_new(0x20);
    ASTArray::ASTArray(pAVar5,4);
    if (local_138.ref != (Ref *)0x0) {
      (local_138.ref)->count = (local_138.ref)->count + 1;
    }
    local_98.ref = local_138.ref;
    pAVar5 = ASTArray::add(pAVar5,&local_98);
    if (Ilang_AST.ref != (Ref *)0x0) {
      (Ilang_AST.ref)->count = (Ilang_AST.ref)->count + 1;
    }
    local_a0.ref = Ilang_AST.ref;
    pAVar5 = ASTArray::add(pAVar5,&local_a0);
    if (Ilangs_AST.ref != (Ref *)0x0) {
      (Ilangs_AST.ref)->count = (Ilangs_AST.ref)->count + 1;
    }
    local_a8.ref = Ilangs_AST.ref;
    pAVar5 = ASTArray::add(pAVar5,&local_a8);
    if (LL_AST.ref != (Ref *)0x0) {
      (LL_AST.ref)->count = (LL_AST.ref)->count + 1;
    }
    local_b0.ref = LL_AST.ref;
    ASTArray::add(pAVar5,&local_b0);
    ASTFactory::make((ASTFactory *)&tmp171_AST,(ASTArray *)pAVar1);
    RefCount<AST>::operator=(&languageSpecItem_AST,&tmp171_AST);
    RefCount<AST>::~RefCount(&tmp171_AST);
    RefCount<AST>::~RefCount(&local_b0);
    RefCount<AST>::~RefCount(&local_a8);
    RefCount<AST>::~RefCount(&local_a0);
    RefCount<AST>::~RefCount(&local_98);
    RefCount<AST>::operator=(&currentAST.root,&languageSpecItem_AST);
    if (languageSpecItem_AST.ref == (Ref *)0x0) {
      pAVar10 = (AST *)0x0;
    }
    else {
      pAVar10 = (languageSpecItem_AST.ref)->ptr;
    }
    if (nullAST.ref == (Ref *)0x0) {
      pAVar9 = (AST *)0x0;
    }
    else {
      pAVar9 = (nullAST.ref)->ptr;
    }
    if (pAVar10 == pAVar9) {
LAB_0017b10b:
      if (languageSpecItem_AST.ref != (Ref *)0x0) {
        (languageSpecItem_AST.ref)->count = (languageSpecItem_AST.ref)->count + 1;
      }
      tmp171_AST = languageSpecItem_AST;
    }
    else {
      AST::getFirstChild((languageSpecItem_AST.ref)->ptr);
      if (local_160.ref == (Ref *)0x0) {
        pAVar7 = (AST *)0x0;
      }
      else {
        pAVar7 = (local_160.ref)->ptr;
      }
      if (nullAST.ref == (Ref *)0x0) {
        pAVar8 = (AST *)0x0;
      }
      else {
        pAVar8 = (nullAST.ref)->ptr;
      }
      if (pAVar7 == pAVar8) goto LAB_0017b10b;
      AST::getFirstChild((languageSpecItem_AST.ref)->ptr);
    }
    RefCount<AST>::operator=(&currentAST.child,&tmp171_AST);
  }
  else {
    if (iVar4 != 0xd) {
      pNVar6 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_b8,this,1);
      NoViableAltException::NoViableAltException(pNVar6,&local_b8);
      __cxa_throw(pNVar6,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&tmp171_AST,this,1);
    RefCount<Token>::operator=(&I,(RefCount<Token> *)&tmp171_AST);
    RefCount<Token>::~RefCount((RefCount<Token> *)&tmp171_AST);
    pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
    if (I.ref != (Ref *)0x0) {
      (I.ref)->count = (I.ref)->count + 1;
    }
    local_38.ref = I.ref;
    ASTFactory::create((ASTFactory *)&tmp171_AST,(RefToken *)pAVar1);
    RefCount<AST>::operator=(&I_AST,&tmp171_AST);
    RefCount<AST>::~RefCount(&tmp171_AST);
    RefCount<Token>::~RefCount(&local_38);
    Parser::match((Parser *)this,0xd);
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&tmp171_AST,this,1);
    RefCount<Token>::operator=(&E1,(RefCount<Token> *)&tmp171_AST);
    RefCount<Token>::~RefCount((RefCount<Token> *)&tmp171_AST);
    if (E1.ref != (Ref *)0x0) {
      (E1.ref)->count = (E1.ref)->count + 1;
    }
    local_40.ref = E1.ref;
    ASTFactory::create((ASTFactory *)&tmp171_AST,(RefToken *)pAVar1);
    RefCount<AST>::operator=(&local_110,&tmp171_AST);
    RefCount<AST>::~RefCount(&tmp171_AST);
    RefCount<Token>::~RefCount(&local_40);
    Parser::match((Parser *)this,4);
    iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    if ((iVar4 - 0x4bU < 2) || (iVar4 - 0x50U < 2)) {
LAB_0017ad2d:
      signedInt(this);
      RefCount<AST>::operator=(&Vi1_AST,this_00);
    }
    else {
      if (iVar4 != 0xd) {
        if (iVar4 != 0x11) {
          pNVar6 = (NoViableAltException *)__cxa_allocate_exception(0x40);
          (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_50,this,1);
          NoViableAltException::NoViableAltException(pNVar6,&local_50);
          __cxa_throw(pNVar6,&NoViableAltException::typeinfo,
                      NoViableAltException::~NoViableAltException);
        }
        goto LAB_0017ad2d;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&tmp171_AST,this,1);
      RefCount<Token>::operator=(&Vi2,(RefCount<Token> *)&tmp171_AST);
      RefCount<Token>::~RefCount((RefCount<Token> *)&tmp171_AST);
      if (Vi2.ref != (Ref *)0x0) {
        (Vi2.ref)->count = (Vi2.ref)->count + 1;
      }
      local_48.ref = Vi2.ref;
      ASTFactory::create((ASTFactory *)&tmp171_AST,(RefToken *)pAVar1);
      RefCount<AST>::operator=(&Vi2_AST,&tmp171_AST);
      RefCount<AST>::~RefCount(&tmp171_AST);
      RefCount<Token>::~RefCount(&local_48);
      Parser::match((Parser *)this,0xd);
    }
    RefCount<AST>::operator=(&languageSpecItem_AST,&currentAST.root);
    pAVar5 = (ASTArray *)operator_new(0x20);
    ASTArray::ASTArray(pAVar5,4);
    if (local_110.ref != (Ref *)0x0) {
      (local_110.ref)->count = (local_110.ref)->count + 1;
    }
    local_58.ref = local_110.ref;
    pAVar5 = ASTArray::add(pAVar5,&local_58);
    if (I_AST.ref != (Ref *)0x0) {
      (I_AST.ref)->count = (I_AST.ref)->count + 1;
    }
    local_60.ref = I_AST.ref;
    pAVar5 = ASTArray::add(pAVar5,&local_60);
    if (Vi1_AST.ref != (Ref *)0x0) {
      (Vi1_AST.ref)->count = (Vi1_AST.ref)->count + 1;
    }
    local_68.ref = Vi1_AST.ref;
    pAVar5 = ASTArray::add(pAVar5,&local_68);
    if (Vi2_AST.ref != (Ref *)0x0) {
      (Vi2_AST.ref)->count = (Vi2_AST.ref)->count + 1;
    }
    local_70.ref = Vi2_AST.ref;
    ASTArray::add(pAVar5,&local_70);
    ASTFactory::make((ASTFactory *)&tmp171_AST,(ASTArray *)pAVar1);
    RefCount<AST>::operator=(&languageSpecItem_AST,&tmp171_AST);
    RefCount<AST>::~RefCount(&tmp171_AST);
    RefCount<AST>::~RefCount(&local_70);
    RefCount<AST>::~RefCount(&local_68);
    RefCount<AST>::~RefCount(&local_60);
    RefCount<AST>::~RefCount(&local_58);
    RefCount<AST>::operator=(&currentAST.root,&languageSpecItem_AST);
    if (languageSpecItem_AST.ref == (Ref *)0x0) {
      pAVar10 = (AST *)0x0;
    }
    else {
      pAVar10 = (languageSpecItem_AST.ref)->ptr;
    }
    if (nullAST.ref == (Ref *)0x0) {
      pAVar9 = (AST *)0x0;
    }
    else {
      pAVar9 = (nullAST.ref)->ptr;
    }
    if (pAVar10 == pAVar9) {
LAB_0017b186:
      if (languageSpecItem_AST.ref != (Ref *)0x0) {
        (languageSpecItem_AST.ref)->count = (languageSpecItem_AST.ref)->count + 1;
      }
      tmp171_AST = languageSpecItem_AST;
    }
    else {
      AST::getFirstChild((languageSpecItem_AST.ref)->ptr);
      if (local_160.ref == (Ref *)0x0) {
        pAVar7 = (AST *)0x0;
      }
      else {
        pAVar7 = (local_160.ref)->ptr;
      }
      if (nullAST.ref == (Ref *)0x0) {
        pAVar8 = (AST *)0x0;
      }
      else {
        pAVar8 = (nullAST.ref)->ptr;
      }
      if (pAVar7 == pAVar8) goto LAB_0017b186;
      AST::getFirstChild((languageSpecItem_AST.ref)->ptr);
    }
    RefCount<AST>::operator=(&currentAST.child,&tmp171_AST);
  }
  RefCount<AST>::~RefCount(&tmp171_AST);
  if (pAVar10 != pAVar9) {
    RefCount<AST>::~RefCount(&local_160);
  }
  ASTPair::advanceChildToEnd(&currentAST);
  iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar4 == 8) {
    iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar3 = BitSet::member(&_tokenSet_45,iVar4);
    if (bVar3) {
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
      bVar3 = BitSet::member(&_tokenSet_4,iVar4);
      RVar2 = nullAST;
      if (bVar3) {
        if (nullAST.ref != (Ref *)0x0) {
          (nullAST.ref)->count = (nullAST.ref)->count + 1;
        }
        tmp171_AST = RVar2;
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_100,this,1);
        ASTFactory::create((ASTFactory *)&stack0xffffffffffffff08,
                           (RefToken *)&(this->super_LLkParser).super_Parser.astFactory);
        RefCount<AST>::operator=(&tmp171_AST,(RefCount<AST> *)&stack0xffffffffffffff08);
        RefCount<AST>::~RefCount((RefCount<AST> *)&stack0xffffffffffffff08);
        RefCount<Token>::~RefCount(&local_100);
        Parser::match((Parser *)this,8);
        RefCount<AST>::~RefCount(&tmp171_AST);
        goto LAB_0017b2f7;
      }
    }
  }
  iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  bVar3 = BitSet::member(&_tokenSet_45,iVar4);
  if (bVar3) {
    iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar3 = BitSet::member(&_tokenSet_4,iVar4);
    if (bVar3) {
      iVar4 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
      bVar3 = BitSet::member(&_tokenSet_4,iVar4);
      if (bVar3) {
LAB_0017b2f7:
        RefCount<AST>::operator=(this_00,&languageSpecItem_AST);
        RefCount<AST>::~RefCount(&LL_AST);
        RefCount<AST>::~RefCount(&local_138);
        RefCount<Token>::~RefCount(&E2);
        RefCount<AST>::~RefCount(&Ilangs_AST);
        RefCount<Token>::~RefCount(&Ilangs);
        RefCount<AST>::~RefCount(&Ilang_AST);
        RefCount<Token>::~RefCount(&Ilang);
        RefCount<AST>::~RefCount(&Vi2_AST);
        RefCount<Token>::~RefCount(&Vi2);
        RefCount<AST>::~RefCount(&Vi1_AST);
        RefCount<AST>::~RefCount(&local_110);
        RefCount<Token>::~RefCount(&E1);
        RefCount<AST>::~RefCount(&I_AST);
        RefCount<Token>::~RefCount(&I);
        RefCount<AST>::~RefCount(&languageSpecItem_AST);
        ASTPair::~ASTPair(&currentAST);
        return;
      }
    }
  }
  pNVar6 = (NoViableAltException *)__cxa_allocate_exception(0x40);
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_c0,this,1);
  NoViableAltException::NoViableAltException(pNVar6,&local_c0);
  __cxa_throw(pNVar6,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
}

Assistant:

void GrpParser::languageSpecItem() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST languageSpecItem_AST = nullAST;
	RefToken  I = nullToken;
	RefAST I_AST = nullAST;
	RefToken  E1 = nullToken;
	RefAST E1_AST = nullAST;
	RefAST Vi1_AST = nullAST;
	RefToken  Vi2 = nullToken;
	RefAST Vi2_AST = nullAST;
	RefToken  Ilang = nullToken;
	RefAST Ilang_AST = nullAST;
	RefToken  Ilangs = nullToken;
	RefAST Ilangs_AST = nullAST;
	RefToken  E2 = nullToken;
	RefAST E2_AST = nullAST;
	RefAST LL_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case IDENT:
		{
			I = LT(1);
			I_AST = astFactory.create(I);
			match(IDENT);
			E1 = LT(1);
			E1_AST = astFactory.create(E1);
			match(OP_EQ);
			{
			switch ( LA(1)) {
			case LIT_INT:
			case OP_PLUS:
			case OP_MINUS:
			case LITERAL_true:
			case LITERAL_false:
			{
				signedInt();
				Vi1_AST = returnAST;
				break;
			}
			case IDENT:
			{
				Vi2 = LT(1);
				Vi2_AST = astFactory.create(Vi2);
				match(IDENT);
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			languageSpecItem_AST = currentAST.root;
			languageSpecItem_AST = astFactory.make( (new ASTArray(4))->add(E1_AST)->add(I_AST)->add(Vi1_AST)->add(Vi2_AST));
			currentAST.root = languageSpecItem_AST;
			currentAST.child = languageSpecItem_AST!=nullAST &&languageSpecItem_AST->getFirstChild()!=nullAST ?
				languageSpecItem_AST->getFirstChild() : languageSpecItem_AST;
			currentAST.advanceChildToEnd();
			break;
		}
		case LITERAL_language:
		case LITERAL_languages:
		{
			{
			switch ( LA(1)) {
			case LITERAL_language:
			{
				Ilang = LT(1);
				Ilang_AST = astFactory.create(Ilang);
				match(LITERAL_language);
				break;
			}
			case LITERAL_languages:
			{
				Ilangs = LT(1);
				Ilangs_AST = astFactory.create(Ilangs);
				match(LITERAL_languages);
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			E2 = LT(1);
			E2_AST = astFactory.create(E2);
			match(OP_EQ);
			languageCodeList();
			LL_AST = returnAST;
			languageSpecItem_AST = currentAST.root;
			languageSpecItem_AST = astFactory.make( (new ASTArray(4))->add(E2_AST)->add(Ilang_AST)->add(Ilangs_AST)->add(LL_AST));
			currentAST.root = languageSpecItem_AST;
			currentAST.child = languageSpecItem_AST!=nullAST &&languageSpecItem_AST->getFirstChild()!=nullAST ?
				languageSpecItem_AST->getFirstChild() : languageSpecItem_AST;
			currentAST.advanceChildToEnd();
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		if ((LA(1)==OP_SEMI) && (_tokenSet_45.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			RefAST tmp171_AST = nullAST;
			tmp171_AST = astFactory.create(LT(1));
			match(OP_SEMI);
		}
		else if ((_tokenSet_45.member(LA(1))) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_45);
	}
	returnAST = languageSpecItem_AST;
}